

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * cm_archive_entry_pathname_abi_cxx11_(string *__return_storage_ptr__,archive_entry *entry)

{
  Encoding *this;
  wchar_t *wcstr;
  archive_entry *entry_local;
  
  this = (Encoding *)archive_entry_pathname_w(entry);
  cmsys::Encoding::ToNarrow_abi_cxx11_(__return_storage_ptr__,this,wcstr);
  return __return_storage_ptr__;
}

Assistant:

static std::string
cm_archive_entry_pathname(struct archive_entry *entry)
{
#if cmsys_STL_HAS_WSTRING
  return cmsys::Encoding::ToNarrow(
    archive_entry_pathname_w(entry));
#else
  return archive_entry_pathname(entry);
#endif
}